

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirmataMarshaller.cpp
# Opt level: O2

void __thiscall
firmata::FirmataMarshaller::sendSysex
          (FirmataMarshaller *this,uint8_t command,size_t bytec,uint8_t *bytev)

{
  uint8_t *__n;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  bool bVar1;
  
  if (this->FirmataStream != (Stream *)0x0) {
    __n = bytev;
    serial_wiring::Stream::write(this->FirmataStream,0xf0,(void *)bytec,(size_t)bytev);
    serial_wiring::Stream::write(this->FirmataStream,(uint)command,__buf,(size_t)__n);
    __buf_00 = extraout_RDX;
    while (bVar1 = bytec != 0, bytec = bytec - 1, bVar1) {
      __n = (uint8_t *)0x0;
      encodeByteStream(this,1,bytev,0);
      bytev = bytev + 1;
      __buf_00 = extraout_RDX_00;
    }
    serial_wiring::Stream::write(this->FirmataStream,0xf7,__buf_00,(size_t)__n);
    return;
  }
  return;
}

Assistant:

void FirmataMarshaller::sendSysex(uint8_t command, size_t bytec, uint8_t *bytev)
const
{
  if ( (Stream *)NULL == FirmataStream ) { return; }
  size_t i;
  FirmataStream->write(START_SYSEX);
  FirmataStream->write(command);
  for (i = 0; i < bytec; ++i) {
    encodeByteStream(sizeof(bytev[i]), reinterpret_cast<uint8_t *>(&bytev[i]));
  }
  FirmataStream->write(END_SYSEX);
}